

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetrepaintmanager.cpp
# Opt level: O1

void __thiscall QWidgetPrivate::invalidateBackingStore<QRegion>(QWidgetPrivate *this,QRegion *r)

{
  QWidget *this_00;
  QWExtra *pQVar1;
  char cVar2;
  QWidget *pQVar3;
  long lVar4;
  long in_FS_OFFSET;
  QRegion masked;
  QRegion clipped;
  QRect local_50;
  QRegion local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  cVar2 = QRegion::isEmpty();
  if (((cVar2 == '\0') && (cVar2 = QCoreApplication::closingDown(), cVar2 == '\0')) &&
     (this_00 = *(QWidget **)&this->field_0x8, (this_00->data->widget_attributes & 0x8400) == 0x8000
     )) {
    pQVar3 = QWidget::window(this_00);
    lVar4 = *(long *)(*(long *)&pQVar3->field_0x8 + 0x78);
    if (lVar4 == 0) {
      lVar4 = 0;
    }
    else {
      lVar4 = *(long *)(lVar4 + 8);
    }
    if (((lVar4 != 0) && (*(long *)(lVar4 + 0x10) != 0)) && (*(long *)(lVar4 + 8) != 0)) {
      local_40.d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
      QRegion::QRegion(&local_40,r);
      local_50 = clipRect(this);
      QRegion::operator&=(&local_40,&local_50);
      cVar2 = QRegion::isEmpty();
      if (cVar2 == '\0') {
        if (((this->graphicsEffect == (QGraphicsEffect *)0x0) &&
            (pQVar1 = (this->extra)._M_t.
                      super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t.
                      super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
                      super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl, pQVar1 != (QWExtra *)0x0
            )) && ((pQVar1->field_0x7c & 0x80) != 0)) {
          local_50._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
          QRegion::QRegion((QRegion *)&local_50,&pQVar1->mask);
          QRegion::operator&=((QRegion *)&local_50,&local_40);
          cVar2 = QRegion::isEmpty();
          if (cVar2 == '\0') {
            QWidgetRepaintManager::markDirty<QRegion>
                      (*(QWidgetRepaintManager **)(lVar4 + 8),(QRegion *)&local_50,this_00,
                       UpdateLater,BufferInvalid);
          }
          QRegion::~QRegion((QRegion *)&local_50);
        }
        else {
          QWidgetRepaintManager::markDirty<QRegion>
                    (*(QWidgetRepaintManager **)(lVar4 + 8),&local_40,this_00,UpdateLater,
                     BufferInvalid);
        }
      }
      QRegion::~QRegion(&local_40);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidgetPrivate::invalidateBackingStore(const T &r)
{
    if (r.isEmpty())
        return;

    if (QCoreApplication::closingDown())
        return;

    Q_Q(QWidget);
    if (!q->isVisible() || !q->updatesEnabled())
        return;

    QTLWExtra *tlwExtra = q->window()->d_func()->maybeTopData();
    if (!tlwExtra || !tlwExtra->backingStore || !tlwExtra->repaintManager)
        return;

    T clipped(r);
    clipped &= clipRect();
    if (clipped.isEmpty())
        return;

    if (!graphicsEffect && extra && extra->hasMask) {
        QRegion masked(extra->mask);
        masked &= clipped;
        if (masked.isEmpty())
            return;

        tlwExtra->repaintManager->markDirty(masked, q,
            QWidgetRepaintManager::UpdateLater, QWidgetRepaintManager::BufferInvalid);
    } else {
        tlwExtra->repaintManager->markDirty(clipped, q,
            QWidgetRepaintManager::UpdateLater, QWidgetRepaintManager::BufferInvalid);
    }
}